

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O1

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(DynamicRectMatrix<double> *this,SelfType *m)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  
  allocate(this,m->nrow_,m->ncol_);
  uVar1 = this->nrow_;
  if ((ulong)uVar1 != 0) {
    uVar2 = this->ncol_;
    ppdVar3 = m->data_;
    ppdVar4 = this->data_;
    uVar7 = 0;
    do {
      if ((ulong)uVar2 != 0) {
        pdVar5 = ppdVar3[uVar7];
        pdVar6 = ppdVar4[uVar7];
        uVar8 = 0;
        do {
          pdVar6[uVar8] = pdVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
  }
  return;
}

Assistant:

DynamicRectMatrix(const SelfType& m) {
      allocate(m.getNRow(), m.getNCol());

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = m.data_[i][j];
    }